

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_lsrkstep_io.c
# Opt level: O3

int LSRKStepSetDomEigSafetyFactor(void *arkode_mem,sunrealtype dom_eig_safety)

{
  int iVar1;
  ARKodeLSRKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeLSRKStepMem local_20;
  double local_18;
  ARKodeMem local_8;
  
  local_18 = dom_eig_safety;
  iVar1 = lsrkStep_AccessARKODEStepMem
                    (arkode_mem,"LSRKStepSetDomEigSafetyFactor",&local_8,&local_20);
  if (iVar1 == 0) {
    local_20->dom_eig_safety =
         (sunrealtype)
         (~-(ulong)(local_18 < 1.0) & (ulong)local_18 |
         -(ulong)(local_18 < 1.0) & 0x3ff028f5c28f5c29);
  }
  return iVar1;
}

Assistant:

int LSRKStepSetDomEigSafetyFactor(void* arkode_mem, sunrealtype dom_eig_safety)
{
  ARKodeMem ark_mem;
  ARKodeLSRKStepMem step_mem;
  int retval;

  /* access ARKodeMem and ARKodeLSRKStepMem structures */
  retval = lsrkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem,
                                        &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  if (dom_eig_safety < SUN_RCONST(1.0))
  {
    step_mem->dom_eig_safety = DOM_EIG_SAFETY_DEFAULT;
  }
  else { step_mem->dom_eig_safety = dom_eig_safety; }

  return ARK_SUCCESS;
}